

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedVariableAggregateTypeCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramInterface interface,ProgramResourcePropFlags targetProp,DataType dataType,
               string *nameSuffix,int depth)

{
  DataType DVar1;
  Variable *this;
  ResourceTestCase *this_00;
  char *name;
  Node *ptr;
  ArrayElement *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  SharedPtr arrayElement;
  undefined1 local_90 [8];
  SharedPtr structMember;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ProgramResourceQueryTestTarget local_54 [2];
  undefined1 local_40 [8];
  SharedPtr variable;
  DataType dataType_local;
  ProgramResourcePropFlags targetProp_local;
  ProgramInterface interface_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  variable.m_state._4_4_ = dataType;
  this = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this,parentStructure,variable.m_state._4_4_);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_40,(Node *)this);
  this_00 = (ResourceTestCase *)operator_new(0xb0);
  structMember.m_state._7_1_ = 1;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget(local_54,interface,targetProp);
  std::operator+(&local_78,"var",nameSuffix);
  name = (char *)std::__cxx11::string::c_str();
  ResourceTestCase::ResourceTestCase(this_00,context,(SharedPtr *)local_40,local_54,name);
  structMember.m_state._7_1_ = 0;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_00);
  std::__cxx11::string::~string((string *)&local_78);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_40);
  if (0 < depth) {
    ptr = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)ptr,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_90,ptr);
    DVar1 = variable.m_state._4_4_;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &arrayElement.m_state,"_struct",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,(SharedPtr *)local_90,targetGroup,interface,targetProp,DVar1,
               (string *)&arrayElement.m_state,depth + -1);
    std::__cxx11::string::~string((string *)&arrayElement.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_90);
    this_01 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(this_01,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_c0,(Node *)this_01);
    DVar1 = variable.m_state._4_4_;
    std::operator+(&local_e0,"_array",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,(SharedPtr *)local_c0,targetGroup,interface,targetProp,DVar1,&local_e0,
               depth + -1);
    std::__cxx11::string::~string((string *)&local_e0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_c0);
  }
  return;
}

Assistant:

static void generateBufferBackedVariableAggregateTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, ProgramInterface interface, ProgramResourcePropFlags targetProp, glu::DataType dataType, const std::string& nameSuffix, int depth)
{
	// variable
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, dataType));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, targetProp), ("var" + nameSuffix).c_str()));
	}

	// struct
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr structMember(new ResourceDefinition::StructMember(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, structMember, targetGroup, interface, targetProp, dataType, "_struct" + nameSuffix, depth - 1);
	}

	// array
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, arrayElement, targetGroup, interface, targetProp, dataType, "_array" + nameSuffix, depth - 1);
	}
}